

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.cpp
# Opt level: O0

Ray * __thiscall Area::sample(Ray *__return_storage_ptr__,Area *this)

{
  float fVar1;
  int iVar2;
  cosineWeightedHemisphere *this_00;
  result_type __s;
  float __b;
  float __b_00;
  Ray local_e4;
  undefined1 local_cc [12];
  Vector3f local_c0 [2];
  cosineWeightedHemisphere *local_a8;
  Sampler *sampler;
  Hit cosineWeightedHit;
  Vector3f local_74;
  Vector3f local_68;
  Vector3f local_5c;
  Vector3f local_50;
  undefined1 local_44 [8];
  Vector3f source;
  float sideTwoScale;
  float sideOneScale;
  uniform_real_distribution<float> sideTwoDist;
  uniform_real_distribution<float> sideOneDist;
  default_random_engine generator;
  Area *this_local;
  
  iVar2 = rand();
  __s = (result_type)iVar2;
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&sideOneDist,
             __s);
  iVar2 = (int)__s;
  Vector3f::abs(&this->_sideOne,iVar2);
  std::uniform_real_distribution<float>::uniform_real_distribution(&sideTwoDist,0.0,__b);
  Vector3f::abs(&this->_sideTwo,iVar2);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)&sideTwoScale,0.0,__b_00);
  source.m_elements[2] =
       std::uniform_real_distribution<float>::operator()
                 (&sideTwoDist,
                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                  &sideOneDist);
  source.m_elements[1] =
       std::uniform_real_distribution<float>::operator()
                 ((uniform_real_distribution<float> *)&sideTwoScale,
                  (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                  &sideOneDist);
  fVar1 = source.m_elements[2];
  Vector3f::normalized(&local_68);
  ::operator*(fVar1,&local_5c);
  operator+(&local_50,&this->_corner);
  fVar1 = source.m_elements[1];
  Vector3f::normalized((Vector3f *)(cosineWeightedHit.normal.m_elements + 2));
  ::operator*(fVar1,&local_74);
  operator+((Vector3f *)local_44,&local_50);
  Hit::Hit((Hit *)&sampler);
  Hit::set((Hit *)&sampler,0.0,(this->super_Object3D).material,&this->_normal);
  this_00 = (cosineWeightedHemisphere *)operator_new(8);
  cosineWeightedHemisphere::cosineWeightedHemisphere(this_00);
  local_a8 = this_00;
  Ray::Ray(&local_e4,(Vector3f *)local_44,&this->_normal);
  (*(this_00->super_Sampler)._vptr_Sampler[2])(local_cc,this_00,&local_e4,&sampler);
  Vector3f::normalized(local_c0);
  Ray::Ray(__return_storage_ptr__,(Vector3f *)local_44,local_c0);
  return __return_storage_ptr__;
}

Assistant:

const Ray Area::sample() {
    // First, select a random point on the area.
    // Create generators for the sampling and get random lengths.
    std::default_random_engine generator(rand());
    std::uniform_real_distribution<float> sideOneDist(0., _sideOne.abs());
    std::uniform_real_distribution<float> sideTwoDist(0., _sideTwo.abs());
    float sideOneScale = sideOneDist(generator);
    float sideTwoScale = sideTwoDist(generator);

    // Fetch the random point and use a cosine weighted sampler (first two args don't matter).
    Vector3f source = _corner + sideOneScale * _sideOne.normalized() + sideTwoScale * _sideTwo.normalized();
    Hit cosineWeightedHit;
    cosineWeightedHit.set(0, this->material, _normal);
    Sampler *sampler = new cosineWeightedHemisphere;
    return Ray(source, sampler->sample(Ray(source, _normal), cosineWeightedHit).normalized());
}